

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O2

int smf_get_length_pulses(smf_t *smf)

{
  smf_track_t *track;
  smf_event_t *psVar1;
  int iVar2;
  int track_number;
  
  iVar2 = 0;
  track_number = 1;
  while( true ) {
    if (smf->number_of_tracks < track_number) {
      return iVar2;
    }
    track = smf_get_track_by_number(smf,track_number);
    if (track == (smf_track_t *)0x0) break;
    psVar1 = smf_track_get_last_event(track);
    if ((psVar1 != (smf_event_t *)0x0) && (iVar2 < psVar1->time_pulses)) {
      iVar2 = psVar1->time_pulses;
    }
    track_number = track_number + 1;
  }
  __assert_fail("track",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0x418,"int smf_get_length_pulses(const smf_t *)");
}

Assistant:

int
smf_get_length_pulses(const smf_t *smf)
{
	int pulses = 0, i;

	for (i = 1; i <= smf->number_of_tracks; i++) {
		smf_track_t *track;
		smf_event_t *event;

	       	track = smf_get_track_by_number(smf, i);
		assert(track);

		event = smf_track_get_last_event(track);
		/* Empty track? */
		if (event == NULL)
			continue;

		if (event->time_pulses > pulses)
			pulses = event->time_pulses;
	}

	return (pulses);
}